

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::InternalUnpackTo
          (internal *this,string_view type_url,ValueType *value,Message *message)

{
  bool bVar1;
  string_view type_name;
  string_view type_url_00;
  GetTypeNameReturnType local_48;
  
  MessageLite::GetTypeName_abi_cxx11_(&local_48,(MessageLite *)value);
  type_name._M_str = local_48._M_dataplus._M_p;
  type_name._M_len = local_48._M_string_length;
  type_url_00._M_str = (char *)type_url._M_len;
  type_url_00._M_len = (size_t)this;
  bVar1 = InternalUnpackToLite
                    (type_name,type_url_00,(ValueType *)type_url._M_str,(MessageLite *)value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool InternalUnpackTo(absl::string_view type_url, const ValueType& value,
                      Message* message) {
  return InternalUnpackToLite(message->GetTypeName(), type_url, value, message);
}